

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprFunction(Parse *pParse,ExprList *pList,Token *pToken)

{
  sqlite3 *in_RDX;
  anon_union_8_2_a01b6dbf_for_x in_RSI;
  sqlite3 *in_RDI;
  sqlite3 *db;
  Expr *pNew;
  Expr *in_stack_ffffffffffffffc8;
  Parse *pParse_00;
  undefined8 in_stack_ffffffffffffffd8;
  Expr *local_8;
  
  pParse_00 = (Parse *)in_RDI->pVfs;
  local_8 = sqlite3ExprAlloc(in_RDI,in_RSI._4_4_,(Token *)in_RDX,
                             (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (local_8 == (Expr *)0x0) {
    sqlite3ExprListDelete(in_RDX,(ExprList *)0x0);
    local_8 = (Expr *)0x0;
  }
  else {
    local_8->x = in_RSI;
    sqlite3ExprSetHeightAndFlags(pParse_00,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprFunction(Parse *pParse, ExprList *pList, Token *pToken){
  Expr *pNew;
  sqlite3 *db = pParse->db;
  assert( pToken );
  pNew = sqlite3ExprAlloc(db, TK_FUNCTION, pToken, 1);
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList); /* Avoid memory leak when malloc fails */
    return 0;
  }
  pNew->x.pList = pList;
  assert( !ExprHasProperty(pNew, EP_xIsSelect) );
  sqlite3ExprSetHeightAndFlags(pParse, pNew);
  return pNew;
}